

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testanimators.cpp
# Opt level: O0

int main(void)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  Am_Wrapper *pAVar5;
  undefined8 uVar6;
  Am_Value_List *pAVar7;
  Am_Object *pAVar8;
  Am_Constraint *pAVar9;
  ulong uVar10;
  Am_Object AVar11;
  Am_Method_Wrapper *pAVar12;
  Am_Slot_Flags flags;
  Am_Object local_298;
  Am_Object local_290;
  Am_Object local_288;
  Am_Object local_280;
  Am_Object local_278;
  Am_Object local_270;
  Am_Object local_268;
  Am_Formula local_260 [16];
  Am_Formula local_250 [16];
  Am_Object local_240;
  Am_Object local_238;
  Am_Object local_230;
  Am_Formula local_228 [16];
  Am_Formula local_218 [16];
  Am_Object local_208;
  Am_Object local_200;
  Am_Object local_1f8;
  Am_Object interpolator;
  Am_Object local_1e8;
  Am_Object local_1e0;
  Am_Object local_1d8;
  Am_Formula local_1d0 [16];
  Am_Object local_1c0;
  Am_Object local_1b8;
  Am_Time local_1b0 [8];
  Am_Object local_1a8;
  Am_Formula local_1a0 [16];
  Am_Object local_190;
  Am_Object local_188;
  Am_Time local_180 [8];
  Am_Object local_178;
  Am_Formula local_170 [16];
  Am_Object local_160;
  Am_Object local_158;
  Am_Object local_150;
  Am_Object local_148;
  Am_Object local_140;
  Am_Object local_138;
  Am_Time local_130 [8];
  Am_Object local_128;
  Am_Time local_120 [8];
  Am_Object local_118;
  Am_Object local_110;
  Am_Object local_108;
  Am_Object local_100;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Value_List local_c0 [16];
  Am_Value_List local_b0 [8];
  Am_Value_List line_rects;
  Am_Image_Array local_a0 [8];
  Am_Style local_98 [8];
  Am_Style thickblack;
  Am_Style local_88 [8];
  Am_Style thickred;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50 [3];
  Am_Object local_38;
  Am_Value_List local_30 [16];
  Am_Value_List local_20 [8];
  Am_Value_List color_rects;
  Am_Slot_Key MOVER;
  
  Am_Initialize();
  uVar1 = Am_Register_Slot_Name("MOVER");
  Am_Value_List::Am_Value_List(local_30);
  make_color_rect((Am_Style *)&local_38);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_38);
  uVar6 = Am_Value_List::Add(local_30,pAVar5,1);
  make_color_rect((Am_Style *)local_50);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(local_50);
  uVar6 = Am_Value_List::Add(uVar6,pAVar5,1);
  make_color_rect((Am_Style *)&local_58);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_58);
  uVar6 = Am_Value_List::Add(uVar6,pAVar5,1);
  make_color_rect((Am_Style *)&local_60);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_60);
  uVar6 = Am_Value_List::Add(uVar6,pAVar5,1);
  make_color_rect((Am_Style *)&local_68);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_68);
  uVar6 = Am_Value_List::Add(uVar6,pAVar5,1);
  make_color_rect((Am_Style *)&local_70);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_70);
  uVar6 = Am_Value_List::Add(uVar6,pAVar5,1);
  make_color_rect((Am_Style *)&local_78);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_78);
  uVar6 = Am_Value_List::Add(uVar6,pAVar5,1);
  make_color_rect(&thickred);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&thickred);
  pAVar7 = (Am_Value_List *)Am_Value_List::Add(uVar6,pAVar5,1);
  Am_Value_List::Am_Value_List(local_20,pAVar7);
  Am_Object::~Am_Object((Am_Object *)&thickred);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(local_50);
  Am_Object::~Am_Object(&local_38);
  Am_Value_List::~Am_Value_List(local_30);
  Am_Image_Array::Am_Image_Array((Am_Image_Array *)&thickblack,(Am_Image_Array *)&Am_No_Image);
  Am_Style::Am_Style((Am_Style *)0x3f800000,0,local_88,7,1,0,0,&Am_DEFAULT_DASH_LIST,2,0,0,
                     &thickblack);
  Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&thickblack);
  Am_Image_Array::Am_Image_Array(local_a0,(Am_Image_Array *)&Am_No_Image);
  Am_Style::Am_Style((Am_Style *)0x0,0,local_98,7,1,0,0,&Am_DEFAULT_DASH_LIST,2,0,0,local_a0);
  Am_Image_Array::~Am_Image_Array(local_a0);
  Am_Value_List::Am_Value_List(local_c0);
  Am_Object::Create((char *)&local_c8);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
  uVar2 = Am_Object::Set((ushort)&local_c8,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Black);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar8);
  uVar6 = Am_Value_List::Add(local_c0,pAVar5,1);
  Am_Object::Create((char *)&local_d0);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
  uVar2 = Am_Object::Set((ushort)&local_d0,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar8);
  uVar6 = Am_Value_List::Add(uVar6,pAVar5,1);
  Am_Object::Create((char *)&local_d8);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
  uVar2 = Am_Object::Set((ushort)&local_d8,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_(local_88);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar8);
  uVar6 = Am_Value_List::Add(uVar6,pAVar5,1);
  Am_Object::Create((char *)&local_e0);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
  uVar2 = Am_Object::Set((ushort)&local_e0,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_(local_98);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar8);
  pAVar7 = (Am_Value_List *)Am_Value_List::Add(uVar6,pAVar5,1);
  Am_Value_List::Am_Value_List(local_b0,pAVar7);
  Am_Object::~Am_Object(&local_e0);
  Am_Object::~Am_Object(&local_d8);
  Am_Object::~Am_Object(&local_d0);
  Am_Object::~Am_Object(&local_c8);
  Am_Value_List::~Am_Value_List(local_c0);
  Am_Value_List::Start();
  Am_Value_List::Start();
  Am_Object::Create((char *)&local_e8);
  uVar2 = Am_Object::Set((ushort)&local_e8,100,10);
  pAVar9 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Bottom_Is_Bottom_Of_Owner);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x65,(ulong)pAVar9);
  pAVar9 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Horizontal_Layout);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x94,(ulong)pAVar9);
  uVar2 = Am_Object::Set(uVar2,true,1);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(local_20);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0xa2,(ulong)pAVar5);
  uVar10 = Am_Value_List::Get();
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,(Am_Value *)0x169,uVar10);
  Am_Object::operator=(&palette,pAVar8);
  Am_Object::~Am_Object(&local_e8);
  Am_Object::Create((char *)&local_f0);
  pAVar9 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Right_Is_Right_Of_Owner);
  uVar2 = Am_Object::Set((ushort)&local_f0,(Am_Constraint *)0x64,(ulong)pAVar9);
  pAVar9 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Bottom_Is_Bottom_Of_Owner);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x65,(ulong)pAVar9);
  pAVar9 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Horizontal_Layout);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x94,(ulong)pAVar9);
  uVar2 = Am_Object::Set(uVar2,true,1);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(local_b0);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0xa2,(ulong)pAVar5);
  uVar10 = Am_Value_List::Get();
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,(Am_Value *)0x169,uVar10);
  Am_Object::operator=(&line_palette,pAVar8);
  Am_Object::~Am_Object(&local_f0);
  Am_Object::Create((char *)&local_100);
  uVar2 = Am_Object::Set((ushort)&local_100,0xa0,10);
  uVar2 = Am_Object::Set(uVar2,0xa1,10);
  uVar2 = Am_Object::Set(uVar2,100,0);
  uVar2 = Am_Object::Set(uVar2,0x65,0x28);
  uVar2 = Am_Object::Set(uVar2,0x66,0x280);
  uVar2 = Am_Object::Set(uVar2,0x67,0x1b8);
  Am_Object::Create((char *)&local_110);
  uVar3 = Am_Object::Set((ushort)&local_110,100,0x78);
  uVar3 = Am_Object::Set(uVar3,0x65,0x78);
  uVar3 = Am_Object::Set(uVar3,0x66,0x32);
  uVar3 = Am_Object::Set(uVar3,0x67,0x32);
  uVar10 = Am_Formula::Multi_Constraint(true);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x6a,uVar10);
  Am_Object::Create((char *)&local_118);
  Am_Time::Am_Time(local_120,2000);
  pAVar5 = Am_Time::operator_cast_to_Am_Wrapper_(local_120);
  pAVar8 = (Am_Object *)Am_Object::Set((ushort)&local_118,(Am_Wrapper *)0xfd,(ulong)pAVar5);
  pAVar8 = (Am_Object *)Am_Object::operator=(&coloranimation,pAVar8);
  uVar10 = Am_Animate_With(pAVar8);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x6a,uVar10);
  uVar10 = Am_Formula::Multi_Constraint(true);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x6b,uVar10);
  Am_Object::Create((char *)&local_128);
  Am_Time::Am_Time(local_130,3000);
  pAVar5 = Am_Time::operator_cast_to_Am_Wrapper_(local_130);
  pAVar8 = (Am_Object *)Am_Object::Set((ushort)&local_128,(Am_Wrapper *)0xfd,(ulong)pAVar5);
  uVar10 = Am_Animate_With(pAVar8);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x6b,uVar10);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Black);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  Am_Object::Create((char *)&local_138);
  uVar4 = Am_Object::Set((ushort)&local_138,100,0);
  uVar4 = Am_Object::Set(uVar4,0x65,0);
  uVar4 = Am_Object::Set(uVar4,0x66,1);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar4,0x67,1);
  pAVar8 = (Am_Object *)Am_Object::operator=(&rectvisibleanimation,pAVar8);
  uVar10 = Am_Animate_With(pAVar8);
  AVar11.data = (Am_Object_Data *)Am_Object::Set(uVar3,(Am_Constraint *)0x69,uVar10);
  Am_Object::Create((char *)&local_140);
  pAVar8 = (Am_Object *)Am_Object::Add_Part(AVar11,SUB81(&local_140,0),1);
  pAVar8 = (Am_Object *)Am_Object::operator=(&Mover,pAVar8);
  Am_Object::Am_Object(&local_108,pAVar8);
  AVar11.data._2_6_ = 0;
  AVar11.data._0_2_ = uVar1;
  AVar11.data = (Am_Object_Data *)Am_Object::Add_Part(uVar2,AVar11,(ulong)&local_108);
  Am_Object::Create((char *)&local_158);
  uVar10 = Am_Object::Set((ushort)&local_158,(char *)0xb9,0x10e3a9);
  Am_Object::Get_Object((ushort)&local_150,uVar10);
  pAVar12 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&key_press);
  flags = Am_Object::Set((ushort)&local_150,(Am_Method_Wrapper *)0xca,(ulong)pAVar12);
  Am_Object::Get_Owner(&local_148,flags);
  pAVar8 = (Am_Object *)Am_Object::Add_Part(AVar11,SUB81(&local_148,0),1);
  pAVar8 = (Am_Object *)Am_Object::operator=(&window,pAVar8);
  Am_Object::Am_Object(&local_f8,pAVar8);
  Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_f8,0),1);
  Am_Object::~Am_Object(&local_f8);
  Am_Object::~Am_Object(&local_148);
  Am_Object::~Am_Object(&local_150);
  Am_Object::~Am_Object(&local_158);
  Am_Object::~Am_Object(&local_108);
  Am_Object::~Am_Object(&local_140);
  Am_Object::~Am_Object(&local_138);
  Am_Time::~Am_Time(local_130);
  Am_Object::~Am_Object(&local_128);
  Am_Time::~Am_Time(local_120);
  Am_Object::~Am_Object(&local_118);
  Am_Object::~Am_Object(&local_110);
  Am_Object::~Am_Object(&local_100);
  Am_Object::Create((char *)&local_160);
  Am_From_Sibling((ushort)local_170,uVar1);
  pAVar9 = Am_Formula::operator_cast_to_Am_Constraint_(local_170);
  uVar2 = Am_Object::Set((ushort)&local_160,(Am_Constraint *)0x64,(ulong)pAVar9);
  Am_Object::Create((char *)&local_178);
  Am_Time::Am_Time(local_180,1000);
  pAVar5 = Am_Time::operator_cast_to_Am_Wrapper_(local_180);
  uVar3 = Am_Object::Set((ushort)&local_178,(Am_Wrapper *)0xe9,(ulong)pAVar5);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar3,0x183,0x14);
  uVar10 = Am_Animate_With(pAVar8);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x64,uVar10);
  uVar2 = Am_Object::Set(uVar2,0x65,0x14);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Green);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::operator=(&hopper,pAVar8);
  Am_Time::~Am_Time(local_180);
  Am_Object::~Am_Object(&local_178);
  Am_Formula::~Am_Formula(local_170);
  Am_Object::~Am_Object(&local_160);
  Am_Object::Am_Object(&local_188,&hopper);
  Am_Object::Add_Part((Am_Object)0x1124c0,SUB81(&local_188,0),1);
  Am_Object::~Am_Object(&local_188);
  Am_Object::Create((char *)&local_190);
  uVar2 = Am_Object::Set((ushort)&local_190,0x66,0x14);
  uVar2 = Am_Object::Set(uVar2,0x67,0x14);
  Am_From_Sibling((ushort)local_1a0,uVar1);
  pAVar9 = Am_Formula::operator_cast_to_Am_Constraint_(local_1a0);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x65,(ulong)pAVar9);
  Am_Object::Create((char *)&local_1a8);
  Am_Time::Am_Time(local_1b0,4000);
  pAVar5 = Am_Time::operator_cast_to_Am_Wrapper_(local_1b0);
  pAVar8 = (Am_Object *)Am_Object::Set((ushort)&local_1a8,(Am_Wrapper *)0xfd,(ulong)pAVar5);
  uVar10 = Am_Animate_With(pAVar8);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x65,uVar10);
  uVar2 = Am_Object::Set(uVar2,100,10);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Orange);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::operator=(&fixed_time,pAVar8);
  Am_Time::~Am_Time(local_1b0);
  Am_Object::~Am_Object(&local_1a8);
  Am_Formula::~Am_Formula(local_1a0);
  Am_Object::~Am_Object(&local_190);
  Am_Object::Am_Object(&local_1b8,&fixed_time);
  Am_Object::Add_Part((Am_Object)0x1124c0,SUB81(&local_1b8,0),1);
  Am_Object::~Am_Object(&local_1b8);
  Am_Object::Create((char *)&local_1c0);
  uVar2 = Am_Object::Set((ushort)&local_1c0,0x66,0x14);
  uVar2 = Am_Object::Set(uVar2,0x67,0x14);
  Am_From_Sibling((ushort)local_1d0,uVar1);
  pAVar9 = Am_Formula::operator_cast_to_Am_Constraint_(local_1d0);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x65,(ulong)pAVar9);
  Am_Object::Create((char *)&local_1d8);
  pAVar8 = (Am_Object *)Am_Object::Set((ushort)&local_1d8,0x10f,4);
  uVar10 = Am_Animate_With(pAVar8);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x65,uVar10);
  uVar2 = Am_Object::Set(uVar2,100,0x3c);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Create((char *)&local_1e0);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  uVar3 = Am_Object::Set((ushort)&local_1e0,(Am_Wrapper *)0x181,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Green);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0x182,(ulong)pAVar5);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar3,true,0);
  pAVar8 = (Am_Object *)Am_Object::operator=(&wiggler_blink,pAVar8);
  uVar10 = Am_Animate_With(pAVar8);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x6a,uVar10);
  Am_Object::Create((char *)&local_1e8);
  pAVar8 = (Am_Object *)Am_Object::Set((ushort)&local_1e8,true,0);
  pAVar8 = (Am_Object *)Am_Object::operator=(&wiggler_vis_blink,pAVar8);
  uVar10 = Am_Animate_With(pAVar8);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,(Am_Constraint *)0x69,uVar10);
  Am_Object::operator=(&wiggler,pAVar8);
  Am_Object::~Am_Object(&local_1e8);
  Am_Object::~Am_Object(&local_1e0);
  Am_Object::~Am_Object(&local_1d8);
  Am_Formula::~Am_Formula(local_1d0);
  Am_Object::~Am_Object(&local_1c0);
  Am_Object::Am_Object(&interpolator,&wiggler);
  Am_Object::Add_Part((Am_Object)0x1124c0,SUB81(&interpolator,0),1);
  Am_Object::~Am_Object(&interpolator);
  Am_Object::Create((char *)&local_200);
  pAVar8 = (Am_Object *)Am_Object::Set((ushort)&local_200,true,0);
  Am_Object::Am_Object(&local_1f8,pAVar8);
  Am_Object::~Am_Object(&local_200);
  Am_Object::Create((char *)&local_208);
  Am_From_Sibling((ushort)local_218,uVar1);
  pAVar9 = Am_Formula::operator_cast_to_Am_Constraint_(local_218);
  uVar2 = Am_Object::Set((ushort)&local_208,(Am_Constraint *)0x64,(ulong)pAVar9);
  Am_From_Sibling((ushort)local_228,uVar1);
  pAVar9 = Am_Formula::operator_cast_to_Am_Constraint_(local_228);
  uVar1 = Am_Object::Set(uVar2,(Am_Constraint *)0x65,(ulong)pAVar9);
  uVar10 = Am_Animate_With(&local_1f8);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x64,uVar10);
  uVar10 = Am_Animate_With(&local_1f8);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x65,uVar10);
  uVar1 = Am_Object::Set(uVar1,0x66,0x32);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar1,0x67,0x32);
  Am_Object::operator=(&Animator,pAVar8);
  Am_Formula::~Am_Formula(local_228);
  Am_Formula::~Am_Formula(local_218);
  Am_Object::~Am_Object(&local_208);
  Am_Object::Am_Object(&local_230,&Animator);
  Am_Object::Add_Part((Am_Object)0x1124c0,SUB81(&local_230,0),1);
  Am_Object::~Am_Object(&local_230);
  Am_Object::Am_Object(&local_238,&Mover);
  Am_To_Top((Am_Object_Data *)&local_238);
  Am_Object::~Am_Object(&local_238);
  Am_Object::Create((char *)&local_240);
  Am_From_Owner((ushort)local_250);
  pAVar9 = Am_Formula::operator_cast_to_Am_Constraint_(local_250);
  uVar1 = Am_Object::Set((ushort)&local_240,(Am_Constraint *)0x66,(ulong)pAVar9);
  Am_From_Owner((ushort)local_260);
  pAVar9 = Am_Formula::operator_cast_to_Am_Constraint_(local_260);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x67,(ulong)pAVar9);
  uVar1 = Am_Object::Set(uVar1,0x169,0);
  Am_Object::Create((char *)&local_268);
  pAVar8 = (Am_Object *)Am_Object::Set((ushort)&local_268,true,1);
  uVar10 = Am_Animate_With(pAVar8);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar1,(Am_Constraint *)0x69,uVar10);
  Am_Object::operator=(&fade_group,pAVar8);
  Am_Object::~Am_Object(&local_268);
  Am_Formula::~Am_Formula(local_260);
  Am_Formula::~Am_Formula(local_250);
  Am_Object::~Am_Object(&local_240);
  Am_Point_List::Translate(0x112598,0x1db,true);
  Am_Point_List::Translate(0x112588,0x1db,true);
  Am_Object::Create((char *)&local_270);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  uVar1 = Am_Object::Set((ushort)&local_270,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  pAVar5 = Am_Point_List::operator_cast_to_Am_Wrapper_((Am_Point_List *)triangle_point_list);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0xb2,(ulong)pAVar5);
  Am_Object::operator=(&polygon,pAVar8);
  Am_Object::~Am_Object(&local_270);
  Am_Object::Am_Object(&local_278,&palette);
  AVar11.data = (Am_Object_Data *)Am_Object::Add_Part((Am_Object)0x1124c8,SUB81(&local_278,0),1);
  Am_Object::Am_Object(&local_280,&line_palette);
  AVar11.data = (Am_Object_Data *)Am_Object::Add_Part(AVar11,SUB81(&local_280,0),1);
  Am_Object::Am_Object(&local_288,&polygon);
  Am_Object::Add_Part(AVar11,SUB81(&local_288,0),1);
  Am_Object::~Am_Object(&local_288);
  Am_Object::~Am_Object(&local_280);
  Am_Object::~Am_Object(&local_278);
  Am_Object::Create((char *)&local_290);
  uVar10 = Am_Animate_With(&local_290);
  Am_Object::Set(0x24e0,(Am_Constraint *)0xb2,uVar10);
  Am_Object::~Am_Object(&local_290);
  Am_Object::Am_Object(&local_298,&fade_group);
  Am_Object::Add_Part((Am_Object)0x1124c0,SUB81(&local_298,0),1);
  Am_Object::~Am_Object(&local_298);
  init_pixmaps();
  create_hacked_option_button();
  init_eye();
  Am_Main_Event_Loop();
  Am_Cleanup();
  Am_Object::~Am_Object(&local_1f8);
  Am_Value_List::~Am_Value_List(local_b0);
  Am_Style::~Am_Style(local_98);
  Am_Style::~Am_Style(local_88);
  Am_Value_List::~Am_Value_List(local_20);
  return 0;
}

Assistant:

int
main()
{
  Am_Initialize();

  Am_Slot_Key MOVER = Am_Register_Slot_Name("MOVER");
  //  Am_Slot_Key COLOR = Am_Register_Slot_Name ("COLOR");

  //   Am_Object feedback = Am_Rectangle.Create ("Feedback")
  //     .Set (Am_FILL_STYLE, Am_No_Style)
  //     .Set (Am_LINE_STYLE, Am_Dotted_Line)
  //     .Set (Am_WIDTH, 50)
  //     .Set (Am_HEIGHT, 50)
  //     .Set (Am_VISIBLE, false)
  //   ;

  Am_Value_List color_rects = Am_Value_List()
                                  .Add(make_color_rect(Am_Red))
                                  .Add(make_color_rect(Am_Blue))
                                  .Add(make_color_rect(Am_Green))
                                  .Add(make_color_rect(Am_Yellow))
                                  .Add(make_color_rect(Am_Purple))
                                  .Add(make_color_rect(Am_Cyan))
                                  .Add(make_color_rect(Am_Black))
                                  .Add(make_color_rect(Am_White));

  Am_Style thickred(1.0, 0.0, 0.0, 7);
  Am_Style thickblack(0.0, 0.0, 0.0, 7);
  Am_Value_List line_rects = Am_Value_List()
                                 .Add(Am_Rectangle.Create()
                                          .Set(Am_FILL_STYLE, Am_White)
                                          .Set(Am_LINE_STYLE, Am_Black))
                                 .Add(Am_Rectangle.Create()
                                          .Set(Am_FILL_STYLE, Am_White)
                                          .Set(Am_LINE_STYLE, Am_Red))
                                 .Add(Am_Rectangle.Create()
                                          .Set(Am_FILL_STYLE, Am_White)
                                          .Set(Am_LINE_STYLE, thickred))
                                 .Add(Am_Rectangle.Create()
                                          .Set(Am_FILL_STYLE, Am_White)
                                          .Set(Am_LINE_STYLE, thickblack));
  color_rects.Start();
  line_rects.Start();
  palette = Am_Button_Panel.Create("color palette")
                .Set(Am_LEFT, 10)
                .Set(Am_TOP, Am_Bottom_Is_Bottom_Of_Owner)
                .Set(Am_LAYOUT, Am_Horizontal_Layout)
                .Set(Am_FINAL_FEEDBACK_WANTED, true)
                .Set(Am_ITEMS, color_rects)
                .Set(Am_VALUE, color_rects.Get());
  line_palette = Am_Button_Panel.Create("line palette")
                     .Set(Am_LEFT, Am_Right_Is_Right_Of_Owner)
                     .Set(Am_TOP, Am_Bottom_Is_Bottom_Of_Owner)
                     .Set(Am_LAYOUT, Am_Horizontal_Layout)
                     .Set(Am_FINAL_FEEDBACK_WANTED, true)
                     .Set(Am_ITEMS, line_rects)
                     .Set(Am_VALUE, line_rects.Get());

  Am_Screen.Add_Part(
      window =
          Am_Window.Create("window")
              .Set(Am_RIGHT_OFFSET, 10)
              .Set(Am_BOTTOM_OFFSET, 10)
              .Set(Am_LEFT, 0)
              .Set(Am_TOP, 40)
              .Set(Am_WIDTH, 640)
              .Set(Am_HEIGHT, 440)
              .Add_Part(
                  MOVER,
                  Mover =
                      Am_Rectangle.Create("Grab Me")
                          .Set(Am_LEFT, 120)
                          .Set(Am_TOP, 120)
                          .Set(Am_WIDTH, 50)
                          .Set(Am_HEIGHT, 50)
                          .Set(Am_FILL_STYLE, fetch_color.Multi_Constraint())
                          .Set(Am_FILL_STYLE,
                               Am_Animate_With(
                                   coloranimation =
                                       Am_Style_Animator
                                           .Create("fill_style_interp")
                                           .Set(Am_DURATION, Am_Time(2000))))
                          .Set(Am_LINE_STYLE, fetch_line.Multi_Constraint())
                          .Set(Am_LINE_STYLE,
                               Am_Animate_With(
                                   Am_Style_Animator.Create("line_style_interp")
                                       .Set(Am_DURATION, Am_Time(3000))))
                          .Set(Am_LINE_STYLE, Am_Black)
                          .Set(Am_VISIBLE,
                               Am_Animate_With(
                                   rectvisibleanimation =
                                       Am_Visible_Animator.Create("grow_square")
                                           .Set(Am_LEFT, 0)
                                           .Set(Am_TOP, 0)
                                           .Set(Am_WIDTH, 1)
                                           .Set(Am_HEIGHT, 1)))
                          .Add_Part(Am_Move_Grow_Interactor.Create("Mover")
                                    //.Set (Am_FEEDBACK_OBJECT, feedback)
                                    ))
              //.Add_Part (feedback)
              .Add_Part(Am_One_Shot_Interactor.Create("keyboard press")
                            .Set(Am_START_WHEN, "ANY_KEYBOARD")
                            .Get_Object(Am_COMMAND)
                            .Set(Am_DO_METHOD, key_press)
                            .Get_Owner()));

  hopper = Am_Arc.Create("Hopper")
               .Set(Am_LEFT, Am_From_Sibling(MOVER, Am_LEFT))
               .Set(Am_LEFT,
                    Am_Animate_With(Am_Stepping_Animator.Create("Hopper_Interp")
                                        .Set(Am_REPEAT_DELAY, Am_Time(1000))
                                        .Set(Am_SMALL_INCREMENT, 20)))
               .Set(Am_TOP, 20)
               .Set(Am_FILL_STYLE, Am_Green);
  window.Add_Part(hopper);

  fixed_time =
      Am_Roundtangle.Create("Fixed Time")
          .Set(Am_WIDTH, 20)
          .Set(Am_HEIGHT, 20)
          .Set(Am_TOP, Am_From_Sibling(MOVER, Am_TOP))
          .Set(Am_TOP, Am_Animate_With(Am_Animator.Create("Fixed_Time_Interp")
                                           .Set(Am_DURATION, Am_Time(4000))))
          .Set(Am_LEFT, 10)
          .Set(Am_FILL_STYLE, Am_Orange);
  window.Add_Part(fixed_time);

  wiggler =
      Am_Arc.Create("Wiggler")
          .Set(Am_WIDTH, 20)
          .Set(Am_HEIGHT, 20)
          .Set(Am_TOP, Am_From_Sibling(MOVER, Am_TOP))
          .Set(Am_TOP,
               Am_Animate_With(Am_Exaggerated_Animator.Create("Wiggler_Interp")
                                   .Set(Am_WIGGLE_AMOUNT, 4)))
          .Set(Am_LEFT, 60)
          .Set(Am_FILL_STYLE, Am_Blue)
          .Set(Am_FILL_STYLE,
               Am_Animate_With(wiggler_blink = Am_Blink_Animator.Create()
                                                   .Set(Am_VALUE_1, Am_Blue)
                                                   .Set(Am_VALUE_2, Am_Green)
                                                   .Set(Am_ACTIVE, false)))
          .Set(Am_VISIBLE, Am_Animate_With(wiggler_vis_blink =
                                               Am_Blink_Animator.Create().Set(
                                                   Am_ACTIVE, false)));
  window.Add_Part(wiggler);

  Am_Object interpolator =
      Am_Animator
          .Create("Interp_2D")
          //       .Set (Am_TIMING_FUNCTION, Am_Slow_In_Slow_Out)
          //       .Set (Am_SHARPNESS_1, 3)
          //       .Set (Am_SHARPNESS_2, 3)
          .Set(Am_INTERRUPTIBLE, false);
  Animator = Am_Rectangle.Create("Animator")
                 .Set(Am_LEFT, Am_From_Sibling(MOVER, Am_LEFT))
                 .Set(Am_TOP, Am_From_Sibling(MOVER, Am_TOP))
                 .Set(Am_LEFT, Am_Animate_With(interpolator))
                 .Set(Am_TOP, Am_Animate_With(interpolator))

                 .Set(Am_WIDTH, 50)
                 .Set(Am_HEIGHT, 50);
  window.Add_Part(Animator);

  Am_To_Top(Mover);

  fade_group = Am_Fade_Group.Create("Fade_Group")
                   .Set(Am_WIDTH, Am_From_Owner(Am_WIDTH))
                   .Set(Am_HEIGHT, Am_From_Owner(Am_HEIGHT))
                   .Set(Am_VALUE, 0)
                   .Set(Am_VISIBLE,
                        Am_Animate_With(Am_Visible_Animator.Create("fade").Set(
                            Am_USE_FADING, true)));
  triangle_point_list.Translate(475, 300);
  star_point_list.Translate(475, 300);
  polygon = Am_Polygon.Create("Polygon")
                .Set(Am_FILL_STYLE, Am_Red)
                .Set(Am_POINT_LIST, triangle_point_list);
  fade_group.Add_Part(palette).Add_Part(line_palette).Add_Part(polygon);
  polygon.Set(Am_POINT_LIST, Am_Animate_With(Am_Point_List_Animator.Create()));
  window.Add_Part(fade_group);

#ifdef TESTUSEPIXMAPS
  init_pixmaps();
#endif

  create_hacked_option_button();

  init_eye();

  Am_Main_Event_Loop();
  Am_Cleanup();
  return 0;
}